

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::deletePass(BaseBuilder *this,Pass *pass)

{
  Error EVar1;
  uint32_t uVar2;
  Pass *in_RSI;
  BaseBuilder *in_RDI;
  uint32_t index;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  Error local_4;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    local_4 = DebugUtils::errored(5);
  }
  else if (in_RSI == (Pass *)0x0) {
    local_4 = DebugUtils::errored(2);
  }
  else {
    if (in_RSI->_cb != (BaseBuilder *)0x0) {
      if (in_RSI->_cb != in_RDI) {
        EVar1 = DebugUtils::errored(3);
        return EVar1;
      }
      uVar2 = ZoneVector<asmjit::v1_14::Pass_*>::indexOf
                        (&in_RDI->_passes,(Pass **)&stack0xffffffffffffffe8);
      if (uVar2 == 0xffffffff) {
        DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
      }
      in_RSI->_cb = (BaseBuilder *)0x0;
      ZoneVector<asmjit::v1_14::Pass_*>::removeAt
                ((ZoneVector<asmjit::v1_14::Pass_*> *)in_RDI,(size_t)in_RSI);
    }
    (**in_RSI->_vptr_Pass)();
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::deletePass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (pass->_cb != nullptr) {
    if (pass->_cb != this)
      return DebugUtils::errored(kErrorInvalidState);

    uint32_t index = _passes.indexOf(pass);
    ASMJIT_ASSERT(index != Globals::kNotFound);

    pass->_cb = nullptr;
    _passes.removeAt(index);
  }

  pass->~Pass();
  return kErrorOk;
}